

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_config(lysp_yin_ctx *ctx,uint16_t *flags,lysp_ext_instance **exts)

{
  int iVar1;
  ly_ctx *local_60;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement subelems [1];
  char *temp_val;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  lysp_yin_ctx *ctx_local;
  
  subelems[0].flags = 0;
  subelems[0]._18_6_ = 0;
  ret___1 = LY_STMT_EXTENSION_INSTANCE;
  ret__ = 0;
  subelems[0].type = LY_STMT_NONE;
  subelems[0]._4_4_ = 0;
  subelems[0].dest = (void *)0x0;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ =
           yin_parse_attribute(ctx,YIN_ARG_VALUE,(char **)&subelems[0].flags,Y_STR_ARG,
                               LY_STMT_CONFIG), ctx_local._4_4_ == LY_SUCCESS)) {
    iVar1 = strcmp((char *)subelems[0]._16_8_,"true");
    if (iVar1 == 0) {
      *flags = *flags | 1;
    }
    else {
      iVar1 = strcmp((char *)subelems[0]._16_8_,"false");
      if (iVar1 != 0) {
        if (ctx == (lysp_yin_ctx *)0x0) {
          local_60 = (ly_ctx *)0x0;
        }
        else {
          local_60 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YIN,
                "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                ,subelems[0]._16_8_,"value","config","true","false");
        lydict_remove(ctx->xmlctx->ctx,(char *)subelems[0]._16_8_);
        return LY_EVALID;
      }
      *flags = *flags | 2;
    }
    lydict_remove(ctx->xmlctx->ctx,(char *)subelems[0]._16_8_);
    ctx_local._4_4_ =
         yin_parse_content(ctx,(yin_subelement *)&ret___1,1,flags,LY_STMT_CONFIG,(char **)0x0,exts);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_config(struct lysp_yin_ctx *ctx, uint16_t *flags, struct lysp_ext_instance **exts)
{
    const char *temp_val = NULL;
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &temp_val, Y_STR_ARG, LY_STMT_CONFIG));
    if (strcmp(temp_val, "true") == 0) {
        *flags |= LYS_CONFIG_W;
    } else if (strcmp(temp_val, "false") == 0) {
        *flags |= LYS_CONFIG_R;
    } else {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS2, temp_val, "value", "config",
                "true", "false");
        lydict_remove(ctx->xmlctx->ctx, temp_val);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, temp_val);

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), flags, LY_STMT_CONFIG, NULL, exts));

    return LY_SUCCESS;
}